

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_session_flag(LIBSSH2_SESSION *session,int flag,int value)

{
  int value_local;
  int flag_local;
  LIBSSH2_SESSION *session_local;
  
  if (flag == 1) {
    (session->flag).sigpipe = value;
  }
  else {
    if (flag != 2) {
      return -0x22;
    }
    (session->flag).compress = value;
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_session_flag(LIBSSH2_SESSION * session, int flag, int value)
{
    switch(flag) {
    case LIBSSH2_FLAG_SIGPIPE:
        session->flag.sigpipe = value;
        break;
    case LIBSSH2_FLAG_COMPRESS:
        session->flag.compress = value;
        break;
    default:
        /* unknown flag */
        return LIBSSH2_ERROR_INVAL;
    }

    return LIBSSH2_ERROR_NONE;
}